

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O2

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  size_type sVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  ulong __n;
  uint j;
  ulong uVar6;
  
  uVar5 = 0;
  uVar1 = 0;
  while( true ) {
    __n = (ulong)uVar1;
    sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar2 <= __n) break;
    uVar6 = 0;
    uVar4 = 1;
    while( true ) {
      sVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
      if (sVar2 + ~__n <= uVar6) break;
      uVar4 = uVar4 * 0x25 & *(uint *)(this + 0x40c);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    pbVar3 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,__n);
    uVar5 = (uVar4 * *(int *)(this + (ulong)*pbVar3 * 4 + 0xc) & *(uint *)(this + 0x40c)) + uVar5 &
            *(uint *)(this + 0x40c);
    uVar1 = uVar1 + 1;
  }
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }